

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void google::protobuf::internal::VerifyVersion
               (int headerVersion,int minLibraryVersion,char *filename)

{
  int version;
  int version_00;
  int version_01;
  int version_02;
  string local_a0;
  string local_80;
  undefined1 local_60 [24];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (0x1e9809 < minLibraryVersion) {
    local_60._0_4_ = LOGLEVEL_DFATAL;
    local_60._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/common.cc"
    ;
    local_60._16_4_ = 0x3d;
    local_48._M_p = (pointer)&local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_48);
    VersionString_abi_cxx11_(&local_80,(internal *)(ulong)(uint)minLibraryVersion,version);
    std::__cxx11::string::append((string *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    VersionString_abi_cxx11_(&local_a0,(internal *)0x1e9809,version_00);
    std::__cxx11::string::append((string *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    LogMessage::Finish((LogMessage *)local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (headerVersion < 0x1e9809) {
    local_60._0_4_ = LOGLEVEL_DFATAL;
    local_60._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/common.cc"
    ;
    local_60._16_4_ = 0x48;
    local_48._M_p = (pointer)&local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_48);
    VersionString_abi_cxx11_(&local_80,(internal *)(ulong)(uint)headerVersion,version_01);
    std::__cxx11::string::append((string *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    VersionString_abi_cxx11_(&local_a0,(internal *)0x1e9809,version_02);
    std::__cxx11::string::append((string *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    LogMessage::Finish((LogMessage *)local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void VerifyVersion(int headerVersion,
                   int minLibraryVersion,
                   const char* filename) {
  if (GOOGLE_PROTOBUF_VERSION < minLibraryVersion) {
    // Library is too old for headers.
    GOOGLE_LOG(FATAL)
      << "This program requires version " << VersionString(minLibraryVersion)
      << " of the Protocol Buffer runtime library, but the installed version "
         "is " << VersionString(GOOGLE_PROTOBUF_VERSION) << ".  Please update "
         "your library.  If you compiled the program yourself, make sure that "
         "your headers are from the same version of Protocol Buffers as your "
         "link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
  if (headerVersion < kMinHeaderVersionForLibrary) {
    // Headers are too old for library.
    GOOGLE_LOG(FATAL)
      << "This program was compiled against version "
      << VersionString(headerVersion) << " of the Protocol Buffer runtime "
         "library, which is not compatible with the installed version ("
      << VersionString(GOOGLE_PROTOBUF_VERSION) <<  ").  Contact the program "
         "author for an update.  If you compiled the program yourself, make "
         "sure that your headers are from the same version of Protocol Buffers "
         "as your link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
}